

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.cpp
# Opt level: O3

bool __thiscall
lzham::elemental_vector::increase_capacity
          (elemental_vector *this,uint min_new_capacity,bool grow_hint,uint element_size,
          object_mover pMover,bool nofail)

{
  ulong uVar1;
  void *pvVar2;
  uint uVar3;
  ulong size;
  size_t actual_size;
  char buf [256];
  ulong local_148;
  ulong local_140;
  char local_138 [264];
  
  if (min_new_capacity <= this->m_capacity) {
    return true;
  }
  uVar1 = (ulong)min_new_capacity;
  if ((grow_hint) &&
     (uVar3 = min_new_capacity - (min_new_capacity >> 1 & 0x55555555),
     uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
     1 < ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    uVar1 = uVar1 - 1 >> 0x20 | uVar1 - 1;
    uVar1 = uVar1 >> 0x10 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = (ulong)(((uint)(uVar1 >> 1) | (uint)uVar1) + 1);
  }
  local_140 = (ulong)element_size;
  size = uVar1 * local_140;
  if (pMover == (object_mover)0x0) {
    pvVar2 = lzham_realloc(this->m_malloc_context,this->m_p,size,&local_148,true);
    if (pvVar2 == (void *)0x0) {
      if (nofail) {
        return false;
      }
      pvVar2 = (void *)0x0;
      sprintf_s(local_138,0x100,"vector: lzham_realloc() failed allocating %u bytes",size);
      lzham_fail("buf",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_vector.cpp"
                 ,0x2d);
    }
  }
  else {
    pvVar2 = lzham_malloc(this->m_malloc_context,size,&local_148);
    if (pvVar2 == (void *)0x0) {
      if (nofail) {
        return false;
      }
      sprintf_s(local_138,0x100,"vector: lzham_malloc() failed allocating %u bytes",size);
      lzham_fail("buf",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_vector.cpp"
                 ,0x40);
    }
    (*pMover)(pvVar2,this->m_p,this->m_size);
    if (this->m_p != (void *)0x0) {
      lzham_free(this->m_malloc_context,this->m_p);
    }
  }
  this->m_p = pvVar2;
  if (size < local_148) {
    uVar1 = local_148 / local_140;
  }
  this->m_capacity = (uint)uVar1;
  return true;
}

Assistant:

bool elemental_vector::increase_capacity(uint min_new_capacity, bool grow_hint, uint element_size, object_mover pMover, bool nofail)
   {
      LZHAM_ASSERT(m_size <= m_capacity);
      
#if LZHAM_64BIT_POINTERS
      LZHAM_ASSUME(sizeof(void*) == sizeof(uint64));
      LZHAM_ASSERT(min_new_capacity < (0x400000000ULL / element_size));
#else      
      LZHAM_ASSUME(sizeof(void*) == sizeof(uint32));
      LZHAM_ASSERT(min_new_capacity < (0x7FFF0000U / element_size));
#endif      

      if (m_capacity >= min_new_capacity)
         return true;

      // new_capacity must be 64-bit when compiling on x64.
		size_t new_capacity = (size_t)min_new_capacity;
      if ((grow_hint) && (!math::is_power_of_2(static_cast<uint64>(new_capacity))))
         new_capacity = static_cast<uint>(math::next_pow2(static_cast<uint64>(new_capacity)));

      LZHAM_ASSERT(new_capacity && (new_capacity > m_capacity));

      const size_t desired_size = element_size * new_capacity;
      size_t actual_size;
      if (!pMover)
      {
         void* new_p = lzham_realloc(m_malloc_context, m_p, desired_size, &actual_size, true);
         if (!new_p)
         {
            if (nofail)
            {
               LZHAM_LOG_ERROR(5000);
               return false;
            }
               
            char buf[256];
            sprintf_s(buf, sizeof(buf), "vector: lzham_realloc() failed allocating %u bytes", desired_size);
            LZHAM_FAIL(buf);
         }
         m_p = new_p;
      }
      else
      {
         void* new_p = lzham_malloc(m_malloc_context, desired_size, &actual_size);
         if (!new_p)
         {
            if (nofail)
            {
               LZHAM_LOG_ERROR(5001);
               return false;
            }
               
            LZHAM_LOG_ERROR(5002);

            char buf[256];
            sprintf_s(buf, sizeof(buf), "vector: lzham_malloc() failed allocating %u bytes", desired_size);
            LZHAM_FAIL(buf);
         }
         
         (*pMover)(new_p, m_p, m_size);
         
         if (m_p)
            lzham_free(m_malloc_context, m_p);

         m_p = new_p;
      }            
      
      if (actual_size > desired_size)
         m_capacity = static_cast<uint>(actual_size / element_size);
      else
         m_capacity = static_cast<uint>(new_capacity);
    
      return true;
   }